

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcSymbol * __thiscall CTcPrsSymtab::find_delete_weak(CTcPrsSymtab *this,char *name,size_t len)

{
  int iVar1;
  undefined4 extraout_var;
  CTcPrsSymtab *curtab;
  CTcPrsSymtab *pCVar3;
  CTcSymbol *pCVar2;
  
  pCVar3 = this;
  while( true ) {
    iVar1 = (*pCVar3->_vptr_CTcPrsSymtab[2])(pCVar3,name,len);
    pCVar2 = (CTcSymbol *)CONCAT44(extraout_var,iVar1);
    if (pCVar2 != (CTcSymbol *)0x0) break;
    pCVar3 = pCVar3->parent_;
    if (pCVar3 == (CTcPrsSymtab *)0x0) {
      return (CTcSymbol *)0x0;
    }
  }
  (*(pCVar2->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0xf])
            (pCVar2);
  if (*(int *)&(pCVar2->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 != 3
     ) {
    return pCVar2;
  }
  if (((ulong)pCVar2[1].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
              _vptr_CVmHashEntry & 0x40000) != 0) {
    (*this->_vptr_CTcPrsSymtab[4])(this,pCVar2);
    return (CTcSymbol *)0x0;
  }
  return pCVar2;
}

Assistant:

CTcSymbol *CTcPrsSymtab::find_delete_weak(const char *name, size_t len)
{
    /* look up the symbol */
    CTcSymbol *sym = find(name, len);

    /* if it's a weak property definition, delete it */
    if (sym != 0
        && sym->get_type() == TC_SYM_PROP
        && ((CTcSymProp *)sym)->is_weak())
    {
        /* delete it and forget it */
        remove_entry(sym);
        sym = 0;
    }

    /* return what we found */
    return sym;
}